

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_threading.hpp
# Opt level: O0

unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
* chaiscript::detail::threading::
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  ::t(void)

{
  long lVar1;
  long *in_FS_OFFSET;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    lVar1 = *in_FS_OFFSET;
    std::
    unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
    ::unordered_map((unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
                     *)(lVar1 + -0x40));
    __cxa_thread_atexit(std::
                        unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
                        ::~unordered_map,
                        (unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
                         *)(lVar1 + -0x40),&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  return (unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
          *)(*in_FS_OFFSET + -0x40);
}

Assistant:

static std::unordered_map<const void *, T> &t() noexcept {
      static thread_local std::unordered_map<const void *, T> my_t;
      return my_t;
    }